

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O2

void __thiscall xercesc_4_0::WFElemStack::expandMap(WFElemStack *this)

{
  XMLSize_t XVar1;
  int iVar2;
  undefined4 extraout_var;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  double dVar6;
  
  XVar1 = this->fMapCapacity;
  auVar5._8_4_ = (int)(XVar1 >> 0x20);
  auVar5._0_8_ = XVar1;
  auVar5._12_4_ = 0x45300000;
  dVar6 = ((auVar5._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)XVar1) - 4503599627370496.0)) * 1.25;
  uVar3 = (ulong)dVar6;
  uVar4 = 0x10;
  if (XVar1 != 0) {
    uVar4 = (long)(dVar6 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  }
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,uVar4 * 8);
  if (this->fMapCapacity != 0) {
    memcpy((PrefMapElem *)CONCAT44(extraout_var,iVar2),this->fMap,this->fMapCapacity << 3);
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fMap);
  }
  this->fMap = (PrefMapElem *)CONCAT44(extraout_var,iVar2);
  this->fMapCapacity = uVar4;
  return;
}

Assistant:

void WFElemStack::expandMap()
{
    //
    //  Expand the capacity by 25%, or initialize it to 16 if its currently
    //  empty. Then allocate a new temp buffer.
    //
    const XMLSize_t newCapacity = fMapCapacity ?
                                  (XMLSize_t)(fMapCapacity * 1.25) : 16;
    PrefMapElem* newMap = (PrefMapElem*) fMemoryManager->allocate
    (
        newCapacity * sizeof(PrefMapElem)
    );//new PrefMapElem[newCapacity];

    //
    //  Copy over the old stuff. We DON'T have to zero out the new stuff
    //  since this is a by value map and the current map index controls what
    //  is relevant.
    //
    if (fMapCapacity) {

        memcpy(newMap, fMap, fMapCapacity * sizeof(PrefMapElem));
        fMemoryManager->deallocate(fMap);//delete [] fMap;
    }

    fMap = newMap;
    fMapCapacity = newCapacity;
}